

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffs.h
# Opt level: O1

void __thiscall libDAI::Diffs::push(Diffs *this,double x)

{
  iterator __position;
  double *pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  double *pdVar4;
  double *pdVar5;
  double local_10;
  
  pdVar4 = (this->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  __position._M_current =
       (this->super_vector<double,_std::allocator<double>_>).
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  if ((ulong)((long)__position._M_current - (long)pdVar4 >> 3) < this->_maxsize) {
    if (__position._M_current ==
        (this->super_vector<double,_std::allocator<double>_>).
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      local_10 = x;
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)this,__position,&local_10);
    }
    else {
      *__position._M_current = x;
      (this->super_vector<double,_std::allocator<double>_>).
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
           = __position._M_current + 1;
    }
    pdVar2 = (this->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar3 = (this->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    (this->_pos)._M_current = pdVar3;
    if ((ulong)((long)pdVar3 - (long)pdVar2) < 9) {
      (this->_maxpos)._M_current = pdVar2;
    }
    else if (*(this->_maxpos)._M_current < pdVar3[-1]) {
      (this->_maxpos)._M_current = pdVar3 + -1;
    }
  }
  else {
    if ((this->_pos)._M_current == __position._M_current) {
      (this->_pos)._M_current = pdVar4;
    }
    pdVar5 = (this->_pos)._M_current;
    pdVar1 = (this->_maxpos)._M_current;
    if (pdVar1 == pdVar5) {
      (this->_pos)._M_current = pdVar5 + 1;
      *pdVar5 = x;
      pdVar5 = pdVar4 + 1;
      if (pdVar5 != __position._M_current && pdVar4 != __position._M_current) {
        do {
          pdVar1 = pdVar5;
          if (*pdVar5 <= *pdVar4) {
            pdVar1 = pdVar4;
          }
          pdVar4 = pdVar1;
          pdVar5 = pdVar5 + 1;
        } while (pdVar5 != __position._M_current);
      }
      (this->_maxpos)._M_current = pdVar4;
    }
    else {
      if (*pdVar1 < x) {
        (this->_maxpos)._M_current = (this->_pos)._M_current;
      }
      (this->_pos)._M_current = pdVar5 + 1;
      *pdVar5 = x;
    }
  }
  return;
}

Assistant:

void push(double x) {
                if( size() < _maxsize ) {
                    push_back(x);
                    _pos = end();
                    if( size() > 1 ) {
                        if( *_maxpos < back() ) {
                            _maxpos = end();
                            _maxpos--;
                        }
                    } else {
                        _maxpos = begin();
                    }
                }
                else {
                    if( _pos == end() )
                        _pos = begin();
                    if( _maxpos == _pos ) {
                        *_pos++ = x; 
                        _maxpos = max_element(begin(),end());
                    } else {
                        if( x > *_maxpos )
                            _maxpos = _pos;
                        *_pos++ = x;
                    }
                }
            }